

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Chapters::ExpandChaptersArray(Chapters *this)

{
  Chapter *pCVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Chapter *this_00;
  ulong uVar6;
  Chapter *local_b8;
  Chapter *local_90;
  int local_84;
  Chapter *dst;
  Chapter *src;
  int idx;
  Chapter *chapters;
  int size;
  Chapters *this_local;
  
  if (this->chapters_count_ < this->chapters_size_) {
    this_local._7_1_ = true;
  }
  else {
    if (this->chapters_size_ == 0) {
      local_84 = 1;
    }
    else {
      local_84 = this->chapters_size_ << 1;
    }
    uVar3 = (ulong)local_84;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar4 = SUB168(auVar2 * ZEXT816(0x30),0);
    uVar6 = uVar4 + 8;
    if (SUB168(auVar2 * ZEXT816(0x30),8) != 0 || 0xfffffffffffffff7 < uVar4) {
      uVar6 = 0xffffffffffffffff;
    }
    puVar5 = (ulong *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    local_90 = (Chapter *)0x0;
    if (puVar5 != (ulong *)0x0) {
      *puVar5 = uVar3;
      local_90 = (Chapter *)(puVar5 + 1);
      if (uVar3 != 0) {
        local_b8 = local_90;
        do {
          Chapter::Chapter(local_b8);
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_90 + uVar3);
      }
    }
    if (local_90 == (Chapter *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      for (src._0_4_ = 0; (int)src < this->chapters_count_; src._0_4_ = (int)src + 1) {
        Chapter::ShallowCopy(this->chapters_ + (int)src,local_90 + (int)src);
      }
      pCVar1 = this->chapters_;
      if (pCVar1 != (Chapter *)0x0) {
        this_00 = pCVar1 + *(long *)&pCVar1[-1].displays_size_;
        while (pCVar1 != this_00) {
          this_00 = this_00 + -1;
          Chapter::~Chapter(this_00);
        }
        operator_delete__(&pCVar1[-1].displays_size_);
      }
      this->chapters_ = local_90;
      this->chapters_size_ = local_84;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Chapters::ExpandChaptersArray() {
  if (chapters_size_ > chapters_count_)
    return true;  // nothing to do yet

  const int size = (chapters_size_ == 0) ? 1 : 2 * chapters_size_;

  Chapter* const chapters = new (std::nothrow) Chapter[size];  // NOLINT
  if (chapters == NULL)
    return false;

  for (int idx = 0; idx < chapters_count_; ++idx) {
    const Chapter& src = chapters_[idx];
    Chapter* const dst = chapters + idx;
    src.ShallowCopy(dst);
  }

  delete[] chapters_;

  chapters_ = chapters;
  chapters_size_ = size;

  return true;
}